

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O2

void __thiscall
tchecker::clockbounds::local_m_map_t::local_m_map_t(local_m_map_t *this,local_m_map_t *m)

{
  map_t *pmVar1;
  loc_id_t id;
  ulong uVar2;
  allocator_type local_29;
  value_type local_28;
  
  uVar2._0_4_ = m->_loc_nb;
  uVar2._4_4_ = m->_clock_nb;
  this->_loc_nb = (undefined4)uVar2;
  this->_clock_nb = uVar2._4_4_;
  local_28 = (value_type)0x0;
  std::
  vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
  ::vector(&this->_M,uVar2 & 0xffffffff,&local_28,&local_29);
  for (uVar2 = 0; uVar2 < this->_loc_nb; uVar2 = uVar2 + 1) {
    pmVar1 = clone_map((m->_M).
                       super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar2]);
    (this->_M).
    super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar2] = pmVar1;
  }
  return;
}

Assistant:

local_m_map_t::local_m_map_t(tchecker::clockbounds::local_m_map_t const & m)
    : _loc_nb(m._loc_nb), _clock_nb(m._clock_nb), _M(_loc_nb, nullptr)
{
  for (tchecker::loc_id_t id = 0; id < _loc_nb; ++id)
    _M[id] = tchecker::clockbounds::clone_map(*m._M[id]);
}